

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorbase.h
# Opt level: O0

void __thiscall
soplex::VectorBase<double>::VectorBase(VectorBase<double> *this,int dimen,double *p_val)

{
  double *in_RDI;
  double *in_stack_ffffffffffffffd8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffe0;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1d7dd1);
  std::vector<double,std::allocator<double>>::assign<double*,void>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_RDI);
  return;
}

Assistant:

VectorBase(int dimen, R* p_val)
   {
      val.assign(p_val, p_val + dimen);
   }